

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slcand.c
# Opt level: O1

void print_usage(char *prg)

{
  fprintf(_stderr,"%s - userspace daemon for serial line CAN interface driver SLCAN.\n",prg);
  fprintf(_stderr,"\nUsage: %s [options] <tty> [canif-name]\n\n",prg);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("         -o          (send open command \'O\\r\')\n",0x2f,1,_stderr);
  fwrite("         -c          (send close command \'C\\r\')\n",0x30,1,_stderr);
  fwrite("         -f          (read status flags with \'F\\r\' to reset error states)\n",0x4a,1,
         _stderr);
  fwrite("         -l          (send listen only command \'L\\r\', overrides -o)\n",0x44,1,_stderr);
  fwrite("         -s <speed>  (set CAN speed 0..8)\n",0x2a,1,_stderr);
  fwrite("         -S <speed>  (set UART speed in baud)\n",0x2e,1,_stderr);
  fwrite("         -t <type>   (set UART flow control type \'hw\' or \'sw\')\n",0x3f,1,_stderr);
  fwrite("         -b <btr>    (set bit time register value)\n",0x33,1,_stderr);
  fwrite("         -F          (stay in foreground; no daemonize)\n",0x38,1,_stderr);
  fwrite("         -h          (show this help page)\n",0x2b,1,_stderr);
  fwrite("\nExamples:\n",0xb,1,_stderr);
  fwrite("slcand -o -c -f -s6 ttyUSB0\n\n",0x1d,1,_stderr);
  fwrite("slcand -o -c -f -s6 ttyUSB0 can0\n\n",0x22,1,_stderr);
  fwrite("slcand -o -c -f -s6 /dev/ttyUSB0\n\n",0x22,1,_stderr);
  exit(1);
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "%s - userspace daemon for serial line CAN interface driver SLCAN.\n", prg);
	fprintf(stderr, "\nUsage: %s [options] <tty> [canif-name]\n\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -o          (send open command 'O\\r')\n");
	fprintf(stderr, "         -c          (send close command 'C\\r')\n");
	fprintf(stderr, "         -f          (read status flags with 'F\\r' to reset error states)\n");
	fprintf(stderr, "         -l          (send listen only command 'L\\r', overrides -o)\n");
	fprintf(stderr, "         -s <speed>  (set CAN speed 0..8)\n");
	fprintf(stderr, "         -S <speed>  (set UART speed in baud)\n");
	fprintf(stderr, "         -t <type>   (set UART flow control type 'hw' or 'sw')\n");
	fprintf(stderr, "         -b <btr>    (set bit time register value)\n");
	fprintf(stderr, "         -F          (stay in foreground; no daemonize)\n");
	fprintf(stderr, "         -h          (show this help page)\n");
	fprintf(stderr, "\nExamples:\n");
	fprintf(stderr, "slcand -o -c -f -s6 ttyUSB0\n\n");
	fprintf(stderr, "slcand -o -c -f -s6 ttyUSB0 can0\n\n");
	fprintf(stderr, "slcand -o -c -f -s6 /dev/ttyUSB0\n\n");
	exit(EXIT_FAILURE);
}